

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeTableMoveto(BtCursor *pCur,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  MemPage *pMVar5;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  char cVar9;
  u8 *p;
  int iVar10;
  int iVar11;
  int c;
  i64 nCellKey;
  int local_54;
  int local_44;
  int local_40;
  u64 local_38;
  
  if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
    lVar6 = (pCur->info).nKey;
    if (lVar6 == intKey) {
      *pRes = 0;
      return 0;
    }
    if (lVar6 < intKey) {
      if ((pCur->curFlags & 8) != 0) goto LAB_0014c8a7;
      if (lVar6 + 1 == intKey) {
        *pRes = 0;
        iVar7 = sqlite3BtreeNext(pCur,(int)intKey);
        if (iVar7 != 0x65) {
          if (iVar7 != 0) {
            return iVar7;
          }
          getCellInfo(pCur);
          if ((pCur->info).nKey == intKey) {
            return 0;
          }
        }
      }
    }
  }
  iVar7 = moveToRoot(pCur);
  if (iVar7 != 0x10) {
    if (iVar7 != 0) {
      return iVar7;
    }
    local_54 = 0;
    do {
      pMVar5 = pCur->pPage;
      iVar11 = pMVar5->nCell - 1;
      iVar10 = iVar11 >> (1U - (char)biasRight & 0x1f);
      iVar7 = 0;
      do {
        p = pMVar5->aDataOfst +
            (CONCAT11(pMVar5->aCellIdx[(long)iVar10 * 2],pMVar5->aCellIdx[(long)iVar10 * 2 + 1]) &
            pMVar5->maskPage);
        if (pMVar5->intKeyLeaf == '\0') {
LAB_0014c6de:
          sqlite3GetVarint(p,&local_38);
          if ((long)local_38 < intKey) {
            iVar7 = iVar10 + 1;
            if (iVar10 < iVar11) {
LAB_0014c712:
              iVar10 = iVar11 + iVar7 >> 1;
              cVar9 = '\0';
            }
            else {
              local_44 = -1;
LAB_0014c75a:
              cVar9 = '\x04';
            }
          }
          else {
            if (intKey < (long)local_38) {
              iVar11 = iVar10 + -1;
              if (iVar7 < iVar10) goto LAB_0014c712;
              local_44 = 1;
              goto LAB_0014c75a;
            }
            pCur->ix = (u16)iVar10;
            if (pMVar5->leaf != '\0') {
              pCur->curFlags = pCur->curFlags | 2;
              (pCur->info).nKey = local_38;
              (pCur->info).nSize = 0;
              *pRes = 0;
              local_40 = 0;
              goto LAB_0014c74b;
            }
            cVar9 = '\b';
            iVar7 = iVar10;
          }
        }
        else {
          do {
            if (-1 < (char)*p) {
              p = p + 1;
              goto LAB_0014c6de;
            }
            p = p + 1;
          } while (p < pMVar5->aDataEnd);
          local_40 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12603,
                      "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
LAB_0014c74b:
          cVar9 = '\x01';
        }
      } while (cVar9 == '\0');
      if (cVar9 == '\b') {
LAB_0014c7a7:
        if (iVar7 < (int)(uint)pMVar5->nCell) {
          pbVar8 = pMVar5->aData +
                   (ulong)(CONCAT11(pMVar5->aCellIdx[(long)iVar7 * 2],
                                    pMVar5->aCellIdx[(long)iVar7 * 2 + 1]) & pMVar5->maskPage) + 3;
        }
        else {
          pbVar8 = pMVar5->aData + (ulong)pMVar5->hdrOffset + 0xb;
        }
        bVar1 = pbVar8[-3];
        bVar2 = pbVar8[-2];
        bVar3 = pbVar8[-1];
        bVar4 = *pbVar8;
        pCur->ix = (u16)iVar7;
        local_54 = moveToChild(pCur,(uint)bVar4 |
                                    (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18);
        cVar9 = (local_54 != 0) * '\x02';
      }
      else if (cVar9 == '\x04') {
        if (pMVar5->leaf == '\0') goto LAB_0014c7a7;
        pCur->ix = (u16)iVar10;
        *pRes = local_44;
        cVar9 = '\t';
        local_54 = 0;
      }
      if (cVar9 != '\0') {
        if ((cVar9 != '\t') && (cVar9 != '\x02')) {
          return local_40;
        }
        (pCur->info).nSize = 0;
        return local_54;
      }
    } while( true );
  }
LAB_0014c8a7:
  *pRes = -1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTableMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo==0 );
  assert( pCur->eState!=CURSOR_VALID || pCur->curIntKey!=0 );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0 ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowly. */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc!=SQLITE_DONE ){
          return rc;
        }
      }
    }
  }

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey );

  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    for(;;){
      i64 nCellKey;
      pCell = findCellPastPtr(pPage, idx);
      if( pPage->intKeyLeaf ){
        while( 0x80 <= *(pCell++) ){
          if( pCell>=pPage->aDataEnd ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
        }
      }
      getVarint(pCell, (u64*)&nCellKey);
      if( nCellKey<intKey ){
        lwr = idx+1;
        if( lwr>upr ){ c = -1; break; }
      }else if( nCellKey>intKey ){
        upr = idx-1;
        if( lwr>upr ){ c = +1; break; }
      }else{
        assert( nCellKey==intKey );
        pCur->ix = (u16)idx;
        if( !pPage->leaf ){
          lwr = idx;
          goto moveto_table_next_layer;
        }else{
          pCur->curFlags |= BTCF_ValidNKey;
          pCur->info.nKey = nCellKey;
          pCur->info.nSize = 0;
          *pRes = 0;
          return SQLITE_OK;
        }
      }
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
    }
    assert( lwr==upr+1 || !pPage->leaf );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_table_finish;
    }
moveto_table_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_table_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}